

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void fadst8x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar33;
  int iVar34;
  undefined1 auVar30 [16];
  int iVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar40;
  int iVar45;
  int iVar46;
  int iVar47;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar48;
  int iVar50;
  int iVar51;
  int iVar52;
  undefined1 auVar49 [16];
  int iVar53;
  int iVar58;
  int iVar60;
  int iVar62;
  undefined1 auVar55 [16];
  int iVar54;
  int iVar59;
  int iVar61;
  int iVar63;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  
  uVar15 = (ulong)(uint)col_num;
  iVar19 = 1 << ((char)bit - 1U & 0x1f);
  if (0 < col_num) {
    lVar18 = (long)bit * 0x100;
    uVar5 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x1e0);
    auVar24._4_4_ = uVar5;
    auVar24._0_4_ = uVar5;
    auVar24._8_4_ = uVar5;
    auVar24._12_4_ = uVar5;
    iVar6 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x170);
    iVar7 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1a0);
    iVar23 = -iVar7;
    uVar5 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x220);
    iVar20 = -iVar6;
    uVar8 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x250);
    iVar9 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1b0);
    iVar21 = -iVar9;
    uVar10 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x210);
    uVar11 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x1d0);
    iVar12 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1f0);
    iVar22 = -iVar12;
    uVar13 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x230);
    uVar14 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 400);
    lVar18 = 0;
    do {
      piVar1 = (int *)((long)*in + lVar18);
      piVar2 = (int *)((long)in[(uint)(col_num * 7)] + lVar18);
      auVar27 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(col_num * 3)] + lVar18),auVar24);
      auVar30 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(col_num * 4)] + lVar18),auVar24);
      auVar26 = ZEXT416((uint)bit);
      iVar40 = (iVar19 - auVar27._0_4_) + auVar30._0_4_ >> auVar26;
      iVar45 = (iVar19 - auVar27._4_4_) + auVar30._4_4_ >> auVar26;
      iVar46 = (iVar19 - auVar27._8_4_) + auVar30._8_4_ >> auVar26;
      iVar47 = (iVar19 - auVar27._12_4_) + auVar30._12_4_ >> auVar26;
      iVar48 = iVar19 - (auVar30._0_4_ + auVar27._0_4_) >> auVar26;
      iVar50 = iVar19 - (auVar30._4_4_ + auVar27._4_4_) >> auVar26;
      iVar51 = iVar19 - (auVar30._8_4_ + auVar27._8_4_) >> auVar26;
      iVar52 = iVar19 - (auVar30._12_4_ + auVar27._12_4_) >> auVar26;
      auVar30 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(col_num * 2)] + lVar18),auVar24);
      auVar27 = pmulld(*(undefined1 (*) [16])((long)in[(uint)(col_num * 5)] + lVar18),auVar24);
      iVar71 = auVar30._0_4_ + iVar19;
      iVar76 = auVar30._4_4_ + iVar19;
      iVar79 = auVar30._8_4_ + iVar19;
      iVar82 = auVar30._12_4_ + iVar19;
      iVar53 = iVar71 - auVar27._0_4_ >> auVar26;
      iVar58 = iVar76 - auVar27._4_4_ >> auVar26;
      iVar60 = iVar79 - auVar27._8_4_ >> auVar26;
      iVar62 = iVar82 - auVar27._12_4_ >> auVar26;
      piVar4 = (int *)((long)in[uVar15] + lVar18);
      iVar72 = iVar71 + auVar27._0_4_ >> auVar26;
      iVar77 = iVar76 + auVar27._4_4_ >> auVar26;
      iVar80 = iVar79 + auVar27._8_4_ >> auVar26;
      iVar83 = iVar82 + auVar27._12_4_ >> auVar26;
      piVar3 = (int *)((long)in[(uint)(col_num * 6)] + lVar18);
      iVar71 = iVar40 + *piVar1;
      iVar76 = iVar45 + piVar1[1];
      iVar79 = iVar46 + piVar1[2];
      iVar82 = iVar47 + piVar1[3];
      iVar29 = iVar48 - *piVar2;
      iVar33 = iVar50 - piVar2[1];
      iVar34 = iVar51 - piVar2[2];
      iVar35 = iVar52 - piVar2[3];
      iVar40 = *piVar1 - iVar40;
      iVar45 = piVar1[1] - iVar45;
      iVar46 = piVar1[2] - iVar46;
      iVar47 = piVar1[3] - iVar47;
      iVar48 = iVar48 + *piVar2;
      iVar50 = iVar50 + piVar2[1];
      iVar51 = iVar51 + piVar2[2];
      iVar52 = iVar52 + piVar2[3];
      auVar41._0_4_ = iVar53 - *piVar4;
      auVar41._4_4_ = iVar58 - piVar4[1];
      auVar41._8_4_ = iVar60 - piVar4[2];
      auVar41._12_4_ = iVar62 - piVar4[3];
      auVar69._0_4_ = iVar72 + *piVar3;
      auVar69._4_4_ = iVar77 + piVar3[1];
      auVar69._8_4_ = iVar80 + piVar3[2];
      auVar69._12_4_ = iVar83 + piVar3[3];
      auVar55._0_4_ = iVar53 + *piVar4;
      auVar55._4_4_ = iVar58 + piVar4[1];
      auVar55._8_4_ = iVar60 + piVar4[2];
      auVar55._12_4_ = iVar62 + piVar4[3];
      auVar37._4_4_ = iVar7;
      auVar37._0_4_ = iVar7;
      auVar37._8_4_ = iVar7;
      auVar37._12_4_ = iVar7;
      auVar30 = pmulld(auVar41,auVar37);
      auVar27._4_4_ = uVar5;
      auVar27._0_4_ = uVar5;
      auVar27._8_4_ = uVar5;
      auVar27._12_4_ = uVar5;
      auVar27 = pmulld(auVar69,auVar27);
      iVar53 = auVar30._0_4_ + iVar19 + auVar27._0_4_ >> auVar26;
      iVar58 = auVar30._4_4_ + iVar19 + auVar27._4_4_ >> auVar26;
      iVar60 = auVar30._8_4_ + iVar19 + auVar27._8_4_ >> auVar26;
      iVar62 = auVar30._12_4_ + iVar19 + auVar27._12_4_ >> auVar26;
      auVar67._0_4_ = *piVar3 - iVar72;
      auVar67._4_4_ = piVar3[1] - iVar77;
      auVar67._8_4_ = piVar3[2] - iVar80;
      auVar67._12_4_ = piVar3[3] - iVar83;
      auVar30._4_4_ = uVar5;
      auVar30._0_4_ = uVar5;
      auVar30._8_4_ = uVar5;
      auVar30._12_4_ = uVar5;
      auVar27 = pmulld(auVar41,auVar30);
      auVar56._4_4_ = iVar23;
      auVar56._0_4_ = iVar23;
      auVar56._8_4_ = iVar23;
      auVar56._12_4_ = iVar23;
      auVar30 = pmulld(auVar69,auVar56);
      iVar72 = auVar27._0_4_ + iVar19 + auVar30._0_4_ >> auVar26;
      iVar77 = auVar27._4_4_ + iVar19 + auVar30._4_4_ >> auVar26;
      iVar80 = auVar27._8_4_ + iVar19 + auVar30._8_4_ >> auVar26;
      iVar83 = auVar27._12_4_ + iVar19 + auVar30._12_4_ >> auVar26;
      auVar30 = pmulld(auVar37,auVar55);
      auVar70._4_4_ = uVar5;
      auVar70._0_4_ = uVar5;
      auVar70._8_4_ = uVar5;
      auVar70._12_4_ = uVar5;
      auVar27 = pmulld(auVar55,auVar70);
      auVar70 = pmulld(auVar67,auVar37);
      iVar54 = auVar27._0_4_ + iVar19 + auVar70._0_4_ >> auVar26;
      iVar59 = auVar27._4_4_ + iVar19 + auVar70._4_4_ >> auVar26;
      iVar61 = auVar27._8_4_ + iVar19 + auVar70._8_4_ >> auVar26;
      iVar63 = auVar27._12_4_ + iVar19 + auVar70._12_4_ >> auVar26;
      auVar32._4_4_ = uVar5;
      auVar32._0_4_ = uVar5;
      auVar32._8_4_ = uVar5;
      auVar32._12_4_ = uVar5;
      auVar27 = pmulld(auVar67,auVar32);
      iVar73 = (iVar19 - auVar30._0_4_) + auVar27._0_4_ >> auVar26;
      iVar78 = (iVar19 - auVar30._4_4_) + auVar27._4_4_ >> auVar26;
      iVar81 = (iVar19 - auVar30._8_4_) + auVar27._8_4_ >> auVar26;
      iVar84 = (iVar19 - auVar30._12_4_) + auVar27._12_4_ >> auVar26;
      auVar36._0_4_ = iVar53 + iVar71;
      auVar36._4_4_ = iVar58 + iVar76;
      auVar36._8_4_ = iVar60 + iVar79;
      auVar36._12_4_ = iVar62 + iVar82;
      auVar64._0_4_ = iVar72 + iVar29;
      auVar64._4_4_ = iVar77 + iVar33;
      auVar64._8_4_ = iVar80 + iVar34;
      auVar64._12_4_ = iVar83 + iVar35;
      auVar28._0_4_ = iVar71 - iVar53;
      auVar28._4_4_ = iVar76 - iVar58;
      auVar28._8_4_ = iVar79 - iVar60;
      auVar28._12_4_ = iVar82 - iVar62;
      auVar38._0_4_ = iVar54 + iVar40;
      auVar38._4_4_ = iVar59 + iVar45;
      auVar38._8_4_ = iVar61 + iVar46;
      auVar38._12_4_ = iVar63 + iVar47;
      auVar31._0_4_ = iVar29 - iVar72;
      auVar31._4_4_ = iVar33 - iVar77;
      auVar31._8_4_ = iVar34 - iVar80;
      auVar31._12_4_ = iVar35 - iVar83;
      auVar42._0_4_ = iVar73 - iVar48;
      auVar42._4_4_ = iVar78 - iVar50;
      auVar42._8_4_ = iVar81 - iVar51;
      auVar42._12_4_ = iVar84 - iVar52;
      auVar25._0_4_ = iVar40 - iVar54;
      auVar25._4_4_ = iVar45 - iVar59;
      auVar25._8_4_ = iVar46 - iVar61;
      auVar25._12_4_ = iVar47 - iVar63;
      auVar74._0_4_ = iVar73 + iVar48;
      auVar74._4_4_ = iVar78 + iVar50;
      auVar74._8_4_ = iVar81 + iVar51;
      auVar74._12_4_ = iVar84 + iVar52;
      auVar49._4_4_ = iVar6;
      auVar49._0_4_ = iVar6;
      auVar49._8_4_ = iVar6;
      auVar49._12_4_ = iVar6;
      auVar49 = pmulld(auVar36,auVar49);
      auVar65._4_4_ = uVar8;
      auVar65._0_4_ = uVar8;
      auVar65._8_4_ = uVar8;
      auVar65._12_4_ = uVar8;
      auVar56 = pmulld(auVar64,auVar65);
      auVar37 = pmulld(auVar36,auVar65);
      auVar66._4_4_ = iVar20;
      auVar66._0_4_ = iVar20;
      auVar66._8_4_ = iVar20;
      auVar66._12_4_ = iVar20;
      auVar65 = pmulld(auVar64,auVar66);
      auVar57._4_4_ = iVar9;
      auVar57._0_4_ = iVar9;
      auVar57._8_4_ = iVar9;
      auVar57._12_4_ = iVar9;
      auVar57 = pmulld(auVar38,auVar57);
      auVar39._4_4_ = uVar10;
      auVar39._0_4_ = uVar10;
      auVar39._8_4_ = uVar10;
      auVar39._12_4_ = uVar10;
      auVar66 = pmulld(auVar42,auVar39);
      auVar39 = pmulld(auVar38,auVar39);
      auVar43._4_4_ = iVar21;
      auVar43._0_4_ = iVar21;
      auVar43._8_4_ = iVar21;
      auVar43._12_4_ = iVar21;
      auVar43 = pmulld(auVar42,auVar43);
      auVar44._4_4_ = iVar12;
      auVar44._0_4_ = iVar12;
      auVar44._8_4_ = iVar12;
      auVar44._12_4_ = iVar12;
      auVar44 = pmulld(auVar28,auVar44);
      auVar17._4_4_ = uVar11;
      auVar17._0_4_ = uVar11;
      auVar17._8_4_ = uVar11;
      auVar17._12_4_ = uVar11;
      auVar67 = pmulld(auVar31,auVar17);
      auVar30 = pmulld(auVar28,auVar17);
      auVar68._4_4_ = iVar22;
      auVar68._0_4_ = iVar22;
      auVar68._8_4_ = iVar22;
      auVar68._12_4_ = iVar22;
      auVar70 = pmulld(auVar31,auVar68);
      auVar16._4_4_ = uVar13;
      auVar16._0_4_ = uVar13;
      auVar16._8_4_ = uVar13;
      auVar16._12_4_ = uVar13;
      auVar32 = pmulld(auVar25,auVar16);
      auVar75._4_4_ = uVar14;
      auVar75._0_4_ = uVar14;
      auVar75._8_4_ = uVar14;
      auVar75._12_4_ = uVar14;
      auVar68 = pmulld(auVar75,auVar74);
      auVar27 = pmulld(auVar25,auVar75);
      auVar75 = pmulld(auVar74,auVar16);
      piVar1 = (int *)((long)*out + lVar18);
      *piVar1 = auVar37._0_4_ + iVar19 + auVar65._0_4_ >> auVar26;
      piVar1[1] = auVar37._4_4_ + iVar19 + auVar65._4_4_ >> auVar26;
      piVar1[2] = auVar37._8_4_ + iVar19 + auVar65._8_4_ >> auVar26;
      piVar1[3] = auVar37._12_4_ + iVar19 + auVar65._12_4_ >> auVar26;
      piVar1 = (int *)((long)out[uVar15] + lVar18);
      *piVar1 = (auVar32._0_4_ + iVar19) - auVar68._0_4_ >> auVar26;
      piVar1[1] = (auVar32._4_4_ + iVar19) - auVar68._4_4_ >> auVar26;
      piVar1[2] = (auVar32._8_4_ + iVar19) - auVar68._8_4_ >> auVar26;
      piVar1[3] = (auVar32._12_4_ + iVar19) - auVar68._12_4_ >> auVar26;
      piVar1 = (int *)((long)out[(uint)(col_num * 2)] + lVar18);
      *piVar1 = auVar39._0_4_ + iVar19 + auVar43._0_4_ >> auVar26;
      piVar1[1] = auVar39._4_4_ + iVar19 + auVar43._4_4_ >> auVar26;
      piVar1[2] = auVar39._8_4_ + iVar19 + auVar43._8_4_ >> auVar26;
      piVar1[3] = auVar39._12_4_ + iVar19 + auVar43._12_4_ >> auVar26;
      piVar1 = (int *)((long)out[(uint)(col_num * 3)] + lVar18);
      *piVar1 = auVar44._0_4_ + iVar19 + auVar67._0_4_ >> auVar26;
      piVar1[1] = auVar44._4_4_ + iVar19 + auVar67._4_4_ >> auVar26;
      piVar1[2] = auVar44._8_4_ + iVar19 + auVar67._8_4_ >> auVar26;
      piVar1[3] = auVar44._12_4_ + iVar19 + auVar67._12_4_ >> auVar26;
      piVar1 = (int *)((long)out[(uint)(col_num * 4)] + lVar18);
      *piVar1 = auVar30._0_4_ + iVar19 + auVar70._0_4_ >> auVar26;
      piVar1[1] = auVar30._4_4_ + iVar19 + auVar70._4_4_ >> auVar26;
      piVar1[2] = auVar30._8_4_ + iVar19 + auVar70._8_4_ >> auVar26;
      piVar1[3] = auVar30._12_4_ + iVar19 + auVar70._12_4_ >> auVar26;
      piVar1 = (int *)((long)out[(uint)(col_num * 5)] + lVar18);
      *piVar1 = auVar57._0_4_ + iVar19 + auVar66._0_4_ >> auVar26;
      piVar1[1] = auVar57._4_4_ + iVar19 + auVar66._4_4_ >> auVar26;
      piVar1[2] = auVar57._8_4_ + iVar19 + auVar66._8_4_ >> auVar26;
      piVar1[3] = auVar57._12_4_ + iVar19 + auVar66._12_4_ >> auVar26;
      piVar1 = (int *)((long)out[(uint)(col_num * 6)] + lVar18);
      *piVar1 = auVar27._0_4_ + iVar19 + auVar75._0_4_ >> auVar26;
      piVar1[1] = auVar27._4_4_ + iVar19 + auVar75._4_4_ >> auVar26;
      piVar1[2] = auVar27._8_4_ + iVar19 + auVar75._8_4_ >> auVar26;
      piVar1[3] = auVar27._12_4_ + iVar19 + auVar75._12_4_ >> auVar26;
      piVar1 = (int *)((long)out[(uint)(col_num * 7)] + lVar18);
      *piVar1 = auVar49._0_4_ + iVar19 + auVar56._0_4_ >> auVar26;
      piVar1[1] = auVar49._4_4_ + iVar19 + auVar56._4_4_ >> auVar26;
      piVar1[2] = auVar49._8_4_ + iVar19 + auVar56._8_4_ >> auVar26;
      piVar1[3] = auVar49._12_4_ + iVar19 + auVar56._12_4_ >> auVar26;
      lVar18 = lVar18 + 0x10;
    } while (uVar15 * 0x10 != lVar18);
  }
  return;
}

Assistant:

static void fadst8x8_sse4_1(__m128i *in, __m128i *out, int bit,
                            const int col_num) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;
  int col;

  // Note:
  //  Even column: 0, 2, ..., 14
  //  Odd column: 1, 3, ..., 15
  //  one even column plus one odd column constructs one row (8 coeffs)
  //  total we have 8 rows (8x8).
  for (col = 0; col < col_num; ++col) {
    // stage 0
    // stage 1
    u0 = in[col_num * 0 + col];
    u1 = _mm_sub_epi32(zero, in[col_num * 7 + col]);
    u2 = _mm_sub_epi32(zero, in[col_num * 3 + col]);
    u3 = in[col_num * 4 + col];
    u4 = _mm_sub_epi32(zero, in[col_num * 1 + col]);
    u5 = in[col_num * 6 + col];
    u6 = in[col_num * 2 + col];
    u7 = _mm_sub_epi32(zero, in[col_num * 5 + col]);

    // stage 2
    v0 = u0;
    v1 = u1;

    x = _mm_mullo_epi32(u2, cospi32);
    y = _mm_mullo_epi32(u3, cospi32);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    v3 = _mm_sub_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    v4 = u4;
    v5 = u5;

    x = _mm_mullo_epi32(u6, cospi32);
    y = _mm_mullo_epi32(u7, cospi32);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    v7 = _mm_sub_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 3
    u0 = _mm_add_epi32(v0, v2);
    u1 = _mm_add_epi32(v1, v3);
    u2 = _mm_sub_epi32(v0, v2);
    u3 = _mm_sub_epi32(v1, v3);
    u4 = _mm_add_epi32(v4, v6);
    u5 = _mm_add_epi32(v5, v7);
    u6 = _mm_sub_epi32(v4, v6);
    u7 = _mm_sub_epi32(v5, v7);

    // stage 4
    v0 = u0;
    v1 = u1;
    v2 = u2;
    v3 = u3;

    x = _mm_mullo_epi32(u4, cospi16);
    y = _mm_mullo_epi32(u5, cospi48);
    v4 = _mm_add_epi32(x, y);
    v4 = _mm_add_epi32(v4, rnding);
    v4 = _mm_srai_epi32(v4, bit);

    x = _mm_mullo_epi32(u4, cospi48);
    y = _mm_mullo_epi32(u5, cospim16);
    v5 = _mm_add_epi32(x, y);
    v5 = _mm_add_epi32(v5, rnding);
    v5 = _mm_srai_epi32(v5, bit);

    x = _mm_mullo_epi32(u6, cospim48);
    y = _mm_mullo_epi32(u7, cospi16);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    x = _mm_mullo_epi32(u6, cospi16);
    y = _mm_mullo_epi32(u7, cospi48);
    v7 = _mm_add_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 5
    u0 = _mm_add_epi32(v0, v4);
    u1 = _mm_add_epi32(v1, v5);
    u2 = _mm_add_epi32(v2, v6);
    u3 = _mm_add_epi32(v3, v7);
    u4 = _mm_sub_epi32(v0, v4);
    u5 = _mm_sub_epi32(v1, v5);
    u6 = _mm_sub_epi32(v2, v6);
    u7 = _mm_sub_epi32(v3, v7);

    // stage 6
    x = _mm_mullo_epi32(u0, cospi4);
    y = _mm_mullo_epi32(u1, cospi60);
    v0 = _mm_add_epi32(x, y);
    v0 = _mm_add_epi32(v0, rnding);
    v0 = _mm_srai_epi32(v0, bit);

    x = _mm_mullo_epi32(u0, cospi60);
    y = _mm_mullo_epi32(u1, cospim4);
    v1 = _mm_add_epi32(x, y);
    v1 = _mm_add_epi32(v1, rnding);
    v1 = _mm_srai_epi32(v1, bit);

    x = _mm_mullo_epi32(u2, cospi20);
    y = _mm_mullo_epi32(u3, cospi44);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    x = _mm_mullo_epi32(u2, cospi44);
    y = _mm_mullo_epi32(u3, cospim20);
    v3 = _mm_add_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    x = _mm_mullo_epi32(u4, cospi36);
    y = _mm_mullo_epi32(u5, cospi28);
    v4 = _mm_add_epi32(x, y);
    v4 = _mm_add_epi32(v4, rnding);
    v4 = _mm_srai_epi32(v4, bit);

    x = _mm_mullo_epi32(u4, cospi28);
    y = _mm_mullo_epi32(u5, cospim36);
    v5 = _mm_add_epi32(x, y);
    v5 = _mm_add_epi32(v5, rnding);
    v5 = _mm_srai_epi32(v5, bit);

    x = _mm_mullo_epi32(u6, cospi52);
    y = _mm_mullo_epi32(u7, cospi12);
    v6 = _mm_add_epi32(x, y);
    v6 = _mm_add_epi32(v6, rnding);
    v6 = _mm_srai_epi32(v6, bit);

    x = _mm_mullo_epi32(u6, cospi12);
    y = _mm_mullo_epi32(u7, cospim52);
    v7 = _mm_add_epi32(x, y);
    v7 = _mm_add_epi32(v7, rnding);
    v7 = _mm_srai_epi32(v7, bit);

    // stage 7
    out[col_num * 0 + col] = v1;
    out[col_num * 1 + col] = v6;
    out[col_num * 2 + col] = v3;
    out[col_num * 3 + col] = v4;
    out[col_num * 4 + col] = v5;
    out[col_num * 5 + col] = v2;
    out[col_num * 6 + col] = v7;
    out[col_num * 7 + col] = v0;
  }
}